

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcComplexProperty::IfcComplexProperty(IfcComplexProperty *this)

{
  *(undefined8 *)&this->field_0xa8 = 0;
  *(char **)&this->field_0xb0 = "IfcComplexProperty";
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined1 **)
   &(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
    field_0x10 = &(this->super_IfcProperty).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x20;
  *(undefined8 *)
   &(this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
    field_0x18 = 0;
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.field_0x20
       = 0;
  (this->super_IfcProperty).Description.ptr._M_dataplus._M_p =
       (pointer)&(this->super_IfcProperty).Description.ptr.field_2;
  (this->super_IfcProperty).Description.ptr._M_string_length = 0;
  (this->super_IfcProperty).Description.ptr.field_2._M_local_buf[0] = '\0';
  (this->super_IfcProperty).Description.have = false;
  *(undefined8 *)&(this->super_IfcProperty).field_0x60 = 0;
  (this->super_IfcProperty).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8cd6c8;
  *(undefined8 *)&this->field_0xa0 = 0x8cd718;
  *(undefined8 *)&(this->super_IfcProperty).field_0x58 = 0x8cd6f0;
  *(undefined1 **)&(this->super_IfcProperty).field_0x68 = &this->field_0x78;
  *(undefined8 *)&this->field_0x70 = 0;
  this->field_0x78 = 0;
  (this->HasProperties).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HasProperties).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HasProperties).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

IfcComplexProperty() : Object("IfcComplexProperty") {}